

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

void __thiscall
compressed_distance_matrix<(compressed_matrix_layout)0>::
compressed_distance_matrix<compressed_distance_matrix<(compressed_matrix_layout)1>>
          (compressed_distance_matrix<(compressed_matrix_layout)0> *this,
          compressed_distance_matrix<(compressed_matrix_layout)1> *mat)

{
  compressed_distance_matrix<(compressed_matrix_layout)1> *this_00;
  size_t sVar1;
  reference ppfVar2;
  compressed_distance_matrix<(compressed_matrix_layout)0> *in_RDI;
  value_t vVar3;
  size_t j;
  size_t i;
  vector<float_*,_std::allocator<float_*>_> *pvVar4;
  allocator_type *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  undefined1 *__n;
  ulong local_38;
  ulong local_30;
  undefined1 local_25 [37];
  
  compressed_distance_matrix<(compressed_matrix_layout)1>::size
            ((compressed_distance_matrix<(compressed_matrix_layout)1> *)0x14db10);
  compressed_distance_matrix<(compressed_matrix_layout)1>::size
            ((compressed_distance_matrix<(compressed_matrix_layout)1> *)0x14db1f);
  std::allocator<float>::allocator((allocator<float> *)0x14db45);
  std::vector<float,_std::allocator<float>_>::vector
            (&in_RDI->distances,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::allocator<float>::~allocator((allocator<float> *)0x14db65);
  pvVar4 = &in_RDI->rows;
  this_00 = (compressed_distance_matrix<(compressed_matrix_layout)1> *)
            compressed_distance_matrix<(compressed_matrix_layout)1>::size
                      ((compressed_distance_matrix<(compressed_matrix_layout)1> *)0x14db7d);
  __n = local_25;
  std::allocator<float_*>::allocator((allocator<float_*> *)0x14db91);
  std::vector<float_*,_std::allocator<float_*>_>::vector
            ((vector<float_*,_std::allocator<float_*>_> *)in_RDI,(size_type)__n,
             (allocator_type *)this_00);
  std::allocator<float_*>::~allocator((allocator<float_*> *)0x14dbb1);
  init_rows(in_RDI);
  local_30 = 1;
  while( true ) {
    sVar1 = size((compressed_distance_matrix<(compressed_matrix_layout)0> *)0x14dbda);
    if (sVar1 <= local_30) break;
    for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
      vVar3 = compressed_distance_matrix<(compressed_matrix_layout)1>::operator()
                        (this_00,(index_t)((ulong)pvVar4 >> 0x20),(index_t)pvVar4);
      ppfVar2 = std::vector<float_*,_std::allocator<float_*>_>::operator[](&in_RDI->rows,local_30);
      (*ppfVar2)[local_38] = vVar3;
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

compressed_distance_matrix(const DistanceMatrix& mat)
	    : distances(mat.size() * (mat.size() - 1) / 2), rows(mat.size()) {
		init_rows();

		for (size_t i = 1ul; i < size(); ++i)
			for (size_t j = 0ul; j < i; ++j) rows[i][j] = mat(index_t(i), index_t(j));
	}